

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O0

void oonf_subsystem_configure(cfg_schema *schema,oonf_subsystem *subsystem)

{
  oonf_log_source oVar1;
  cfg_schema_section *local_70;
  cfg_schema_section *schema_section;
  oonf_subsystem *subsystem_local;
  cfg_schema *schema_local;
  
  if (subsystem->name == (char *)0x0) {
    if ((log_global_mask[5] & 8) != 0) {
      oonf_log(LOG_SEVERITY_ASSERT,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0x9d,(void *)0x0,0,
               "Subsystem name is not set");
      abort();
    }
  }
  if ((log_global_mask[5] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0x9f,(void *)0x0,0,
             "Configure subsystem %s",subsystem->name);
  }
  if ((subsystem->no_logging & 1U) == 0) {
    if ((log_global_mask[5] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0xa3,(void *)0x0,0,
               "(%s) Register logging source",subsystem->name);
    }
    oVar1 = oonf_log_register_source(subsystem->name);
    subsystem->logging = oVar1;
  }
  else {
    subsystem->logging = LOG_MAIN;
  }
  if (subsystem->early_cfg_init != (_func_void *)0x0) {
    if ((log_global_mask[5] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0xac,(void *)0x0,0,
               "(%s) Call \'early_cfg_init() callback",subsystem->name);
    }
    (*subsystem->early_cfg_init)();
  }
  for (local_70 = subsystem->cfg_section; local_70 != (cfg_schema_section *)0x0;
      local_70 = local_70->next_section) {
    if ((log_global_mask[5] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0xb3,(void *)0x0,0,
               "(%s) Add configuration section %s",subsystem->name,local_70->type);
    }
    cfg_schema_add_section(schema,local_70);
  }
  return;
}

Assistant:

void
oonf_subsystem_configure(struct cfg_schema *schema, struct oonf_subsystem *subsystem) {
  struct cfg_schema_section *schema_section;

  OONF_ASSERT(subsystem->name, LOG_SUBSYSTEMS, "Subsystem name is not set");

  OONF_INFO(LOG_SUBSYSTEMS, "Configure subsystem %s", subsystem->name);

  /* add logging source */
  if (!subsystem->no_logging) {
    OONF_DEBUG(LOG_SUBSYSTEMS, "(%s) Register logging source", subsystem->name);
    subsystem->logging = oonf_log_register_source(subsystem->name);
  }
  else {
    subsystem->logging = LOG_MAIN;
  }

  /* early configuration */
  if (subsystem->early_cfg_init) {
    OONF_DEBUG(LOG_SUBSYSTEMS, "(%s) Call 'early_cfg_init() callback", subsystem->name);
    subsystem->early_cfg_init();
  }

  /* add schema sections to global schema */
  schema_section = subsystem->cfg_section;
  while (schema_section) {
    OONF_DEBUG(LOG_SUBSYSTEMS, "(%s) Add configuration section %s", subsystem->name, schema_section->type);

    cfg_schema_add_section(schema, schema_section);
    schema_section = schema_section->next_section;
  }
}